

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.hpp
# Opt level: O0

string * __thiscall
czh::error::CzhError::get_content_abi_cxx11_(string *__return_storage_ptr__,CzhError *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  CzhError *local_18;
  CzhError *this_local;
  
  local_18 = this;
  this_local = (CzhError *)__return_storage_ptr__;
  std::operator+(&local_78,"\x1b[1;37m",&this->location);
  std::operator+(&local_58,&local_78,": ");
  std::operator+(&local_38,&local_58,"\x1b[0;32;31mError: \x1b[m");
  std::operator+(__return_storage_ptr__,&local_38,&this->detail);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string get_content() const
    {
      return {"\033[1;37m" + location + ": "
              + "\033[0;32;31mError: \033[m" + detail};
    }